

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float fVar1;
  int iVar2;
  ImDrawList *this;
  ImVec2 pos_00;
  ImVec2 IVar3;
  ImVec2 p_min;
  ImVec2 p_max;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  ImGuiID IVar8;
  ImU32 IVar9;
  ImGuiWindow *pIVar10;
  ImGuiContext *g;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  bool hovered;
  float local_f4;
  ImGuiID local_f0;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImVec2 local_88;
  ImRect r_outer;
  ImVec2 size_expected;
  ImRect value_bb;
  ImVec2 pos;
  ImRect total_bb;
  
  pIVar5 = GImGui;
  iVar2 = (GImGui->NextWindowData).SizeConstraintCond;
  (GImGui->NextWindowData).SizeConstraintCond = 0;
  pIVar10 = pIVar5->CurrentWindow;
  pIVar10->WriteAccessed = true;
  if (pIVar10->SkipItems != false) {
    return false;
  }
  IVar8 = ImGuiWindow::GetID(pIVar10,label,(char *)0x0);
  local_f4 = 0.0;
  if ((flags & 0x20U) == 0) {
    local_f4 = GetFrameHeight();
  }
  IVar3 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar12 = IVar3.x;
  fVar13 = local_f4;
  if ((flags & 0x40U) == 0) {
    fVar13 = CalcItemWidth();
  }
  fVar1 = (pIVar5->Style).FramePadding.y;
  frame_bb.Min.x = (pIVar10->DC).CursorPos.x;
  frame_bb.Min.y = (pIVar10->DC).CursorPos.y;
  frame_bb.Max.x = fVar13 + frame_bb.Min.x;
  frame_bb.Max.y = fVar1 + fVar1 + IVar3.y + frame_bb.Min.y;
  fVar14 = 0.0;
  if (0.0 < fVar12) {
    fVar14 = (pIVar5->Style).ItemInnerSpacing.x + fVar12;
  }
  total_bb.Max.x = fVar14 + frame_bb.Max.x;
  total_bb.Max.y = frame_bb.Max.y + 0.0;
  local_f0 = IVar8;
  total_bb.Min.x = frame_bb.Min.x;
  total_bb.Min.y = frame_bb.Min.y;
  ItemSize(&total_bb,fVar1);
  IVar8 = local_f0;
  bVar6 = ItemAdd(&total_bb,local_f0,&frame_bb);
  if (!bVar6) {
    return false;
  }
  bVar6 = ButtonBehavior(&frame_bb,IVar8,&hovered,&held,0);
  bVar7 = IsPopupOpen(IVar8);
  value_bb.Min.y = frame_bb.Min.y;
  value_bb.Min.x = frame_bb.Min.x;
  value_bb.Max.y = frame_bb.Max.y;
  value_bb.Max.x = frame_bb.Max.x - local_f4;
  IVar9 = GetColorU32(hovered + 7,1.0);
  RenderNavHighlight(&frame_bb,IVar8,1);
  if ((flags & 0x40U) == 0) {
    name._4_4_ = frame_bb.Max.y;
    name._0_4_ = frame_bb.Max.x - local_f4;
    ImDrawList::AddRectFilled
              (pIVar10->DrawList,&frame_bb.Min,(ImVec2 *)name,IVar9,(pIVar5->Style).FrameRounding,5)
    ;
  }
  if ((flags & 0x20U) == 0) {
    this = pIVar10->DrawList;
    name._4_4_ = frame_bb.Min.y;
    name._0_4_ = frame_bb.Max.x - local_f4;
    IVar9 = GetColorU32(((byte)(hovered | bVar7) & 1) + 0x15,1.0);
    ImDrawList::AddRectFilled
              (this,(ImVec2 *)name,&frame_bb.Max,IVar9,(pIVar5->Style).FrameRounding,
               (uint)(fVar13 <= local_f4) * 5 + 10);
    fVar1 = (pIVar5->Style).FramePadding.y;
    IVar3.y = fVar1 + frame_bb.Min.y;
    IVar3.x = fVar1 + (frame_bb.Max.x - local_f4);
    RenderArrow(IVar3,3,1.0);
  }
  p_min.y = frame_bb.Min.y;
  p_min.x = frame_bb.Min.x;
  p_max.y = frame_bb.Max.y;
  p_max.x = frame_bb.Max.x;
  RenderFrameBorder(p_min,p_max,(pIVar5->Style).FrameRounding);
  if (preview_value != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
    IVar3 = (pIVar5->Style).FramePadding;
    name._0_4_ = IVar3.x + frame_bb.Min.x;
    name._4_4_ = IVar3.y + frame_bb.Min.y;
    auVar4._8_8_ = 0;
    auVar4._0_4_ = r_outer.Max.x;
    auVar4._4_4_ = r_outer.Max.y;
    r_outer = (ImRect)(auVar4 << 0x40);
    RenderTextClipped((ImVec2 *)name,&value_bb.Max,preview_value,(char *)0x0,(ImVec2 *)0x0,
                      &r_outer.Min,(ImRect *)0x0);
  }
  if (0.0 < fVar12) {
    pos_00.y = (pIVar5->Style).FramePadding.y + frame_bb.Min.y;
    pos_00.x = (pIVar5->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    RenderText(pos_00,label,(char *)0x0,true);
  }
  if (bVar6) {
    if (bVar7) goto LAB_0013cb5d;
  }
  else if (pIVar5->NavActivateId != local_f0 || bVar7) {
    if (!bVar7) {
      return false;
    }
    goto LAB_0013cb5d;
  }
  if ((pIVar10->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
    pIVar10->NavLastIds[0] = local_f0;
  }
  OpenPopupEx(local_f0);
LAB_0013cb5d:
  if (iVar2 == 0) {
    uVar11 = flags | 4;
    if ((flags & 0x1eU) != 0) {
      uVar11 = flags;
    }
    flags = uVar11;
    if ((flags & 4U) == 0) {
      if ((flags & 2U) == 0) {
        uVar11 = -(uint)((flags & 8U) == 0) | 0x14;
      }
      else {
        uVar11 = 4;
      }
    }
    else {
      uVar11 = 8;
    }
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    name._0_4_ = fVar13;
    fVar13 = CalcMaxPopupHeightFromItemCount(uVar11);
    r_outer.Min.y = fVar13;
    r_outer.Min.x = 3.4028235e+38;
    SetNextWindowSizeConstraints((ImVec2 *)name,&r_outer.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
  }
  else {
    (pIVar5->NextWindowData).SizeConstraintCond = iVar2;
    fVar12 = (pIVar5->NextWindowData).SizeConstraintRect.Min.x;
    uVar11 = -(uint)(fVar13 <= fVar12);
    (pIVar5->NextWindowData).SizeConstraintRect.Min.x =
         (float)(~uVar11 & (uint)fVar13 | (uint)fVar12 & uVar11);
  }
  ImFormatString(name,0x10,"##Combo_%02d",(ulong)(uint)(pIVar5->BeginPopupStack).Size);
  pIVar10 = FindWindowByName(name);
  if ((pIVar10 != (ImGuiWindow *)0x0) && (pIVar10->WasActive == true)) {
    size_expected = CalcWindowExpectedSize(pIVar10);
    if ((flags & 1U) != 0) {
      pIVar10->AutoPosLastDirection = 0;
    }
    r_outer = GetWindowAllowedExtentRect(pIVar10);
    local_88.y = frame_bb.Max.y;
    local_88.x = frame_bb.Min.x;
    pos = FindBestWindowPosForPopupEx
                    (&local_88,&size_expected,&pIVar10->AutoPosLastDirection,&r_outer,&frame_bb,
                     ImGuiPopupPositionPolicy_ComboBox);
    local_88.x = 0.0;
    local_88.y = 0.0;
    SetNextWindowPos(&pos,0,&local_88);
  }
  r_outer.Min.y = (pIVar5->Style).WindowPadding.y;
  r_outer.Min.x = (pIVar5->Style).FramePadding.x;
  PushStyleVar(1,&r_outer.Min);
  bVar6 = Begin(name,(bool *)0x0,0x4000143);
  PopStyleVar(1);
  if (!bVar6) {
    EndPopup();
    return bVar6;
  }
  return bVar6;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    ImGuiCond backup_next_window_size_constraint = g.NextWindowData.SizeConstraintCond;
    g.NextWindowData.SizeConstraintCond = 0;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImRect value_bb(frame_bb.Min, frame_bb.Max - ImVec2(arrow_size, 0.0f));
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Max.y), frame_col, style.FrameRounding, ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        window->DrawList->AddRectFilled(ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Min.y), frame_bb.Max, GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button), style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        RenderArrow(ImVec2(frame_bb.Max.x - arrow_size + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), ImGuiDir_Down);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, value_bb.Max, preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (backup_next_window_size_constraint)
    {
        g.NextWindowData.SizeConstraintCond = backup_next_window_size_constraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // Horizontally align ourselves with the framed text
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}